

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddAPI.c
# Opt level: O0

void Cudd_AutodynEnable(DdManager *unique,Cudd_ReorderingType method)

{
  DdNode **local_20;
  Cudd_ReorderingType method_local;
  DdManager *unique_local;
  
  unique->autoDyn = 1;
  if (method != CUDD_REORDER_SAME) {
    unique->autoMethod = method;
  }
  cuddClearDeathRow(unique);
  unique->deathRowDepth = 1;
  unique->deadMask = unique->deathRowDepth - 1;
  if (unique->deadMask < (uint)unique->nextDead) {
    unique->nextDead = 0;
  }
  if (unique->deathRow == (DdNode **)0x0) {
    local_20 = (DdNode **)malloc((long)unique->deathRowDepth << 3);
  }
  else {
    local_20 = (DdNode **)realloc(unique->deathRow,(long)unique->deathRowDepth << 3);
  }
  unique->deathRow = local_20;
  return;
}

Assistant:

void
Cudd_AutodynEnable(
  DdManager * unique,
  Cudd_ReorderingType  method)
{
    unique->autoDyn = 1;
    if (method != CUDD_REORDER_SAME) {
        unique->autoMethod = method;
    }
#ifndef DD_NO_DEATH_ROW
    /* If reordering is enabled, using the death row causes too many
    ** invocations. Hence, we shrink the death row to just one entry.
    */
    cuddClearDeathRow(unique);
    unique->deathRowDepth = 1;
    unique->deadMask = unique->deathRowDepth - 1;
    if ((unsigned) unique->nextDead > unique->deadMask) {
        unique->nextDead = 0;
    }
    unique->deathRow = ABC_REALLOC(DdNodePtr, unique->deathRow,
        unique->deathRowDepth);
#endif
    return;

}